

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecMan.c
# Opt level: O1

void Cec_ManSatPrintStats(Cec_ManSat_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  int level;
  double dVar4;
  double dVar5;
  double dVar6;
  
  level = (int)p;
  Abc_Print(level,"CO = %8d  ",(ulong)(uint)p->pAig->vCos->nSize);
  pGVar3 = p->pAig;
  Abc_Print(level,"AND = %8d  ",
            (ulong)(uint)(~(pGVar3->vCos->nSize + pGVar3->vCis->nSize) + pGVar3->nObjs));
  Abc_Print(level,"Conf = %5d  ",(ulong)(uint)p->pPars->nBTLimit);
  Abc_Print(level,"MinVar = %5d  ",(ulong)(uint)p->pPars->nSatVarMax);
  Abc_Print(level,"MinCalls = %5d\n",(ulong)(uint)p->pPars->nCallsRecycle);
  dVar6 = (double)p->nSatUnsat;
  dVar5 = 0.0;
  dVar4 = 0.0;
  if (p->nSatTotal != 0) {
    dVar4 = (dVar6 * 100.0) / (double)p->nSatTotal;
  }
  if (p->nSatUnsat != 0) {
    dVar5 = (double)p->nConfUnsat / dVar6;
  }
  Abc_Print(level,"Unsat calls %6d  (%6.2f %%)   Ave conf = %8.1f   ",dVar4,dVar5);
  iVar1 = p->timeTotal;
  iVar2 = p->timeSatUnsat;
  Abc_Print(level,"%s =","Time");
  dVar4 = 0.0;
  if (iVar1 != 0) {
    dVar4 = ((double)iVar2 * 100.0) / (double)iVar1;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)iVar2 / 1000000.0,dVar4);
  dVar5 = (double)p->nSatSat;
  dVar4 = 0.0;
  if (p->nSatTotal != 0) {
    dVar4 = (dVar5 * 100.0) / (double)p->nSatTotal;
  }
  dVar6 = 0.0;
  if (p->nSatSat != 0) {
    dVar6 = (double)p->nConfSat / dVar5;
  }
  Abc_Print(level,"Sat   calls %6d  (%6.2f %%)   Ave conf = %8.1f   ",dVar4,dVar6);
  iVar1 = p->timeTotal;
  iVar2 = p->timeSatSat;
  Abc_Print(level,"%s =","Time");
  dVar4 = 0.0;
  if (iVar1 != 0) {
    dVar4 = ((double)iVar2 * 100.0) / (double)iVar1;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)iVar2 / 1000000.0,dVar4);
  dVar5 = (double)p->nSatUndec;
  dVar4 = 0.0;
  if (p->nSatUndec != 0) {
    dVar4 = (double)p->nConfUndec / dVar5;
  }
  dVar6 = 0.0;
  if (p->nSatTotal != 0) {
    dVar6 = (dVar5 * 100.0) / (double)p->nSatTotal;
  }
  Abc_Print(level,"Undef calls %6d  (%6.2f %%)   Ave conf = %8.1f   ",dVar6,dVar4);
  iVar1 = p->timeTotal;
  iVar2 = p->timeSatUndec;
  Abc_Print(level,"%s =","Time");
  dVar4 = 0.0;
  if (iVar1 != 0) {
    dVar4 = ((double)iVar2 * 100.0) / (double)iVar1;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)iVar2 / 1000000.0,dVar4);
  iVar1 = p->timeTotal;
  Abc_Print(level,"%s =","Total time");
  Abc_Print(level,"%9.2f sec\n",(double)iVar1 / 1000000.0);
  return;
}

Assistant:

void Cec_ManSatPrintStats( Cec_ManSat_t * p )
{
    Abc_Print( 1, "CO = %8d  ", Gia_ManCoNum(p->pAig) );
    Abc_Print( 1, "AND = %8d  ", Gia_ManAndNum(p->pAig) );
    Abc_Print( 1, "Conf = %5d  ", p->pPars->nBTLimit );
    Abc_Print( 1, "MinVar = %5d  ", p->pPars->nSatVarMax );
    Abc_Print( 1, "MinCalls = %5d\n", p->pPars->nCallsRecycle );
    Abc_Print( 1, "Unsat calls %6d  (%6.2f %%)   Ave conf = %8.1f   ", 
        p->nSatUnsat, p->nSatTotal? 100.0*p->nSatUnsat/p->nSatTotal : 0.0, p->nSatUnsat? 1.0*p->nConfUnsat/p->nSatUnsat :0.0 );
    Abc_PrintTimeP( 1, "Time", p->timeSatUnsat, p->timeTotal );
    Abc_Print( 1, "Sat   calls %6d  (%6.2f %%)   Ave conf = %8.1f   ", 
        p->nSatSat,   p->nSatTotal? 100.0*p->nSatSat/p->nSatTotal : 0.0,   p->nSatSat? 1.0*p->nConfSat/p->nSatSat : 0.0 );
    Abc_PrintTimeP( 1, "Time", p->timeSatSat,   p->timeTotal );
    Abc_Print( 1, "Undef calls %6d  (%6.2f %%)   Ave conf = %8.1f   ", 
        p->nSatUndec, p->nSatTotal? 100.0*p->nSatUndec/p->nSatTotal : 0.0, p->nSatUndec? 1.0*p->nConfUndec/p->nSatUndec : 0.0 );
    Abc_PrintTimeP( 1, "Time", p->timeSatUndec, p->timeTotal );
    Abc_PrintTime( 1, "Total time", p->timeTotal );
}